

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImVec2 CalcNextScrollFromScrollTargetAndClamp(ImGuiWindow *window)

{
  long in_RDI;
  float fVar1;
  float fVar2;
  float fVar3;
  float snap_y_max;
  float snap_y_min;
  float scroll_target_y;
  float center_y_ratio;
  float decoration_up_height;
  float snap_x_max;
  float snap_x_min;
  float scroll_target_x;
  float center_x_ratio;
  ImVec2 scroll;
  float in_stack_ffffffffffffffc8;
  float in_stack_ffffffffffffffcc;
  float in_stack_ffffffffffffffd0;
  undefined4 local_2c;
  float in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  undefined4 local_18;
  undefined8 local_8;
  
  local_8 = *(ImVec2 *)(in_RDI + 0x5c);
  if (*(float *)(in_RDI + 0x6c) <= 3.4028235e+38 && *(float *)(in_RDI + 0x6c) != 3.4028235e+38) {
    fVar3 = *(float *)(in_RDI + 0x74);
    local_18 = *(float *)(in_RDI + 0x6c);
    in_stack_ffffffffffffffe4 = 0;
    in_stack_ffffffffffffffe0 = *(float *)(in_RDI + 100) + *(float *)(in_RDI + 0x18);
    if (0.0 < *(float *)(in_RDI + 0x7c)) {
      local_18 = CalcScrollEdgeSnap(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,
                                    in_stack_ffffffffffffffc8,0.0,1.795627e-39);
    }
    local_8._4_4_ = (float)((ulong)local_8 >> 0x20);
    local_8 = (ImVec2)CONCAT44(local_8._4_4_,
                               -fVar3 * (*(float *)(in_RDI + 0x20) - *(float *)(in_RDI + 0x84)) +
                               local_18);
  }
  if (*(float *)(in_RDI + 0x70) <= 3.4028235e+38 && *(float *)(in_RDI + 0x70) != 3.4028235e+38) {
    fVar1 = ImGuiWindow::TitleBarHeight
                      ((ImGuiWindow *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0))
    ;
    fVar2 = ImGuiWindow::MenuBarHeight
                      ((ImGuiWindow *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0))
    ;
    fVar3 = *(float *)(in_RDI + 0x78);
    local_2c = *(float *)(in_RDI + 0x70);
    if (0.0 < *(float *)(in_RDI + 0x80)) {
      local_2c = CalcScrollEdgeSnap(0.0,(*(float *)(in_RDI + 0x68) + *(float *)(in_RDI + 0x1c)) -
                                        (fVar1 + fVar2),fVar1,0.0,1.796005e-39);
    }
    local_8 = (ImVec2)CONCAT44(-fVar3 * ((*(float *)(in_RDI + 0x24) - *(float *)(in_RDI + 0x88)) -
                                        (fVar1 + fVar2)) + local_2c,(float)local_8);
  }
  fVar3 = ImMax<float>((float)local_8,0.0);
  fVar1 = ImMax<float>(local_8._4_4_,0.0);
  local_8._4_4_ = (float)(int)fVar1;
  local_8._0_4_ = (float)(int)fVar3;
  if (((*(byte *)(in_RDI + 0x91) & 1) == 0) && ((*(byte *)(in_RDI + 0x93) & 1) == 0)) {
    local_8._0_4_ = ImMin<float>((float)(int)fVar3,*(float *)(in_RDI + 100));
    local_8._4_4_ = ImMin<float>((float)(int)fVar1,*(float *)(in_RDI + 0x68));
  }
  return local_8;
}

Assistant:

static ImVec2 CalcNextScrollFromScrollTargetAndClamp(ImGuiWindow* window)
{
    ImVec2 scroll = window->Scroll;
    if (window->ScrollTarget.x < FLT_MAX)
    {
        float center_x_ratio = window->ScrollTargetCenterRatio.x;
        float scroll_target_x = window->ScrollTarget.x;
        float snap_x_min = 0.0f;
        float snap_x_max = window->ScrollMax.x + window->Size.x;
        if (window->ScrollTargetEdgeSnapDist.x > 0.0f)
            scroll_target_x = CalcScrollEdgeSnap(scroll_target_x, snap_x_min, snap_x_max, window->ScrollTargetEdgeSnapDist.x, center_x_ratio);
        scroll.x = scroll_target_x - center_x_ratio * (window->SizeFull.x - window->ScrollbarSizes.x);
    }
    if (window->ScrollTarget.y < FLT_MAX)
    {
        float decoration_up_height = window->TitleBarHeight() + window->MenuBarHeight();
        float center_y_ratio = window->ScrollTargetCenterRatio.y;
        float scroll_target_y = window->ScrollTarget.y;
        float snap_y_min = 0.0f;
        float snap_y_max = window->ScrollMax.y + window->Size.y - decoration_up_height;
        if (window->ScrollTargetEdgeSnapDist.y > 0.0f)
            scroll_target_y = CalcScrollEdgeSnap(scroll_target_y, snap_y_min, snap_y_max, window->ScrollTargetEdgeSnapDist.y, center_y_ratio);
        scroll.y = scroll_target_y - center_y_ratio * (window->SizeFull.y - window->ScrollbarSizes.y - decoration_up_height);
    }
    scroll.x = IM_FLOOR(ImMax(scroll.x, 0.0f));
    scroll.y = IM_FLOOR(ImMax(scroll.y, 0.0f));
    if (!window->Collapsed && !window->SkipItems)
    {
        scroll.x = ImMin(scroll.x, window->ScrollMax.x);
        scroll.y = ImMin(scroll.y, window->ScrollMax.y);
    }
    return scroll;
}